

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O2

learner<CLASSWEIGHTS::classweights,_example> *
LEARNER::learner<CLASSWEIGHTS::classweights,example>::init_learner<LEARNER::learner<char,example>>
          (classweights *dat,learner<char,_example> *base,
          _func_void_classweights_ptr_learner<char,_example>_ptr_example_ptr *learn,
          _func_void_classweights_ptr_learner<char,_example>_ptr_example_ptr *predict,size_t ws,
          prediction_type_t pred_type)

{
  learner<CLASSWEIGHTS::classweights,_example> *__dest;
  
  __dest = calloc_or_throw<LEARNER::learner<CLASSWEIGHTS::classweights,example>>();
  if (base == (learner<char,_example> *)0x0) {
    *(undefined8 *)(__dest + 0xd8) = 1;
    *(code **)(__dest + 0x98) = noop;
    *(code **)(__dest + 0xb0) = noop;
    *(code **)(__dest + 0x10) = noop;
    *(code **)(__dest + 0x80) = noop_sl;
    *(classweights **)(__dest + 0xb8) = dat;
    *(code **)(__dest + 200) = noop;
    *(code **)(__dest + 0x50) = noop_sensitivity;
    *(classweights **)(__dest + 0x58) = dat;
    *(code **)(__dest + 0x68) = return_simple_example;
  }
  else {
    memcpy(__dest,base,0xe9);
    *(learner<char,_example> **)(__dest + 0x20) = base;
    *(code **)(__dest + 0x50) = recur_sensitivity;
    *(classweights **)(__dest + 0xb8) = dat;
    *(learner<char,_example> **)(__dest + 0xc0) = base;
    *(code **)(__dest + 200) = noop;
    *(size_t *)(__dest + 0xd8) = ws;
    ws = ws * *(long *)(base + 0xe0);
  }
  *(size_t *)(__dest + 0xe0) = ws;
  *(classweights **)(__dest + 0x18) = dat;
  *(_func_void_classweights_ptr_learner<char,_example>_ptr_example_ptr **)(__dest + 0x28) = learn;
  *(_func_void_classweights_ptr_learner<char,_example>_ptr_example_ptr **)(__dest + 0x38) = learn;
  *(_func_void_classweights_ptr_learner<char,_example>_ptr_example_ptr **)(__dest + 0x30) = predict;
  *(undefined8 *)(__dest + 0x40) = 0;
  *(prediction_type_t *)(__dest + 0xd0) = pred_type;
  __dest[0xe8] = (learner<CLASSWEIGHTS::classweights,_example>)0x0;
  return __dest;
}

Assistant:

static learner<T, E>& init_learner(T* dat, L* base, void (*learn)(T&, L&, E&), void (*predict)(T&, L&, E&), size_t ws,
      prediction_type::prediction_type_t pred_type)
  {
    learner<T, E>& ret = calloc_or_throw<learner<T, E> >();

    if (base != nullptr)
    {  // a reduction
      ret = *(learner<T, E>*)(base);
      ret.learn_fd.base = make_base(*base);
      ret.sensitivity_fd.sensitivity_f = (sensitivity_data::fn)recur_sensitivity;
      ret.finisher_fd.data = dat;
      ret.finisher_fd.base = make_base(*base);
      ret.finisher_fd.func = (func_data::fn)noop;
      ret.weights = ws;
      ret.increment = base->increment * ret.weights;
    }
    else  // a base learner
    {
      ret.weights = 1;
      ret.increment = ws;
      ret.end_pass_fd.func = (func_data::fn)noop;
      ret.end_examples_fd.func = (func_data::fn)noop;
      ret.init_fd.func = (func_data::fn)noop;
      ret.save_load_fd.save_load_f = (save_load_data::fn)noop_sl;
      ret.finisher_fd.data = dat;
      ret.finisher_fd.func = (func_data::fn)noop;
      ret.sensitivity_fd.sensitivity_f = (sensitivity_data::fn)noop_sensitivity;
      ret.finish_example_fd.data = dat;
      ret.finish_example_fd.finish_example_f = (finish_example_data::fn)return_simple_example;
    }

    ret.learn_fd.data = dat;
    ret.learn_fd.learn_f = (learn_data::fn)learn;
    ret.learn_fd.update_f = (learn_data::fn)learn;
    ret.learn_fd.predict_f = (learn_data::fn)predict;
    ret.learn_fd.multipredict_f = nullptr;
    ret.pred_type = pred_type;
    ret.is_multiline = std::is_same<multi_ex, E>::value;

    return ret;
  }